

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefinitionsMap.h
# Opt level: O2

bool __thiscall
dg::dda::DefinitionsMap<dg::dda::RWNode>::
add<std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>>
          (DefinitionsMap<dg::dda::RWNode> *this,DefSite *ds,
          vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *nodes)

{
  pointer ppRVar1;
  bool bVar2;
  bool bVar3;
  pointer ppRVar4;
  
  ppRVar1 = (nodes->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  bVar3 = false;
  for (ppRVar4 = (nodes->super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppRVar4 != ppRVar1; ppRVar4 = ppRVar4 + 1
      ) {
    bVar2 = add(this,ds,*ppRVar4);
    bVar3 = (bool)(bVar3 | bVar2);
  }
  return bVar3;
}

Assistant:

bool add(const DefSite &ds, const ContainerT &nodes) {
        bool changed = false;
        for (auto *n : nodes)
            changed |= add(ds, n);
        return changed;
    }